

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::ArticulatedPart::operator==(ArticulatedPart *this,ArticulatedPart *Value)

{
  ArticulatedPart *Value_local;
  ArticulatedPart *this_local;
  
  if ((this->super_VariableParameter).m_ui8VarParamType ==
      (Value->super_VariableParameter).m_ui8VarParamType) {
    if (this->m_ui8ParmeterChange == Value->m_ui8ParmeterChange) {
      if (this->m_ui16AttachementID == Value->m_ui16AttachementID) {
        if (this->m_ui32ParamTypeVariant == Value->m_ui32ParamTypeVariant) {
          if (((float)this->m_f32ParamValue != (float)Value->m_f32ParamValue) ||
             (NAN((float)this->m_f32ParamValue) || NAN((float)Value->m_f32ParamValue))) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL ArticulatedPart::operator == ( const ArticulatedPart & Value ) const
{
    if( m_ui8VarParamType      != Value.m_ui8VarParamType )      return false;
    if( m_ui8ParmeterChange    != Value.m_ui8ParmeterChange )    return false;
    if( m_ui16AttachementID    != Value.m_ui16AttachementID )    return false;
    if( m_ui32ParamTypeVariant != Value.m_ui32ParamTypeVariant ) return false;
    if( m_f32ParamValue        != Value.m_f32ParamValue )        return false;
    return true;
}